

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

string * __thiscall
testing::internal::String::FormatIntWidth2_abi_cxx11_
          (string *__return_storage_ptr__,String *this,int value)

{
  ostream *this_00;
  stringstream ss;
  undefined1 local_188 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  this_00 = std::operator<<(local_188,0x30);
  *(undefined8 *)(this_00 + *(long *)(*(long *)this_00 + -0x18) + 0x10) = 2;
  std::ostream::operator<<(this_00,(int)this);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string String::FormatIntWidth2(int value) {
  std::stringstream ss;
  ss << std::setfill('0') << std::setw(2) << value;
  return ss.str();
}